

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::Pooling3DLayerParams::MergePartialFromCodedStream
          (Pooling3DLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  unsigned_long uVar6;
  char cVar7;
  ulong uVar8;
  pair<unsigned_long,_bool> pVar9;
  
LAB_0013c229:
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0013c24c;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0013c24c:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    uVar5 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) != 0) {
      cVar7 = (char)uVar8;
      switch((uint)(uVar8 >> 3) & 0x1fffffff) {
      case 1:
        if (cVar7 == '\b') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c658;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c658:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->type_ = (int)uVar8;
          goto LAB_0013c229;
        }
        break;
      case 2:
        if (cVar7 == '\x10') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c676;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c676:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->kerneldepth_ = (int32)uVar8;
          goto LAB_0013c229;
        }
        break;
      case 3:
        if (cVar7 == '\x18') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c5fe;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c5fe:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->kernelheight_ = (int32)uVar8;
          goto LAB_0013c229;
        }
        break;
      case 4:
        if (cVar7 == ' ') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c61c;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c61c:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->kernelwidth_ = (int32)uVar8;
          goto LAB_0013c229;
        }
        break;
      case 5:
        if (cVar7 == '(') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c5a4;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c5a4:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->stridedepth_ = (int32)uVar8;
          goto LAB_0013c229;
        }
        break;
      case 6:
        if (cVar7 == '0') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c690;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c690:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->strideheight_ = (int32)uVar8;
          goto LAB_0013c229;
        }
        break;
      case 7:
        if (cVar7 == '8') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c6aa;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c6aa:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->stridewidth_ = (int32)uVar8;
          goto LAB_0013c229;
        }
        break;
      case 8:
        if (cVar7 == '@') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c63a;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c63a:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->custompaddingfront_ = (int32)uVar8;
          goto LAB_0013c229;
        }
        break;
      case 9:
        if (cVar7 == 'H') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c6de;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c6de:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->custompaddingback_ = (int32)uVar8;
          goto LAB_0013c229;
        }
        break;
      case 10:
        if (cVar7 == 'P') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c5e0;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c5e0:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->custompaddingtop_ = (int32)uVar8;
          goto LAB_0013c229;
        }
        break;
      case 0xb:
        if (cVar7 == 'X') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c6c4;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c6c4:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->custompaddingbottom_ = (int32)uVar8;
          goto LAB_0013c229;
        }
        break;
      case 0xc:
        if (cVar7 == '`') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c586;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c586:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->custompaddingleft_ = (int32)uVar8;
          goto LAB_0013c229;
        }
        break;
      case 0xd:
        if (cVar7 == 'h') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c5c2;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c5c2:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->custompaddingright_ = (int32)uVar8;
          goto LAB_0013c229;
        }
        break;
      case 0xe:
        if (cVar7 == 'p') {
          puVar3 = input->buffer_;
          if ((puVar3 < input->buffer_end_) &&
             (uVar6 = (unsigned_long)(char)*puVar3, -1 < (long)uVar6)) {
            input->buffer_ = puVar3 + 1;
          }
          else {
            pVar9 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar6 = pVar9.first;
            if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this->countexcludepadding_ = uVar6 != 0;
          goto LAB_0013c229;
        }
        break;
      case 0xf:
        if (cVar7 == 'x') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0013c568;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_0013c568:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->paddingtype_ = (int)uVar8;
          goto LAB_0013c229;
        }
      }
    }
    if (uVar5 == 0) {
      return true;
    }
    if ((uVar5 & 7) == 4) {
      return true;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    if (!bVar4) {
      return false;
    }
  } while( true );
}

Assistant:

bool Pooling3DLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Pooling3DLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.Pooling3DLayerParams.PoolingType3D type = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_type(static_cast< ::CoreML::Specification::Pooling3DLayerParams_PoolingType3D >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelDepth = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kerneldepth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelHeight = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kernelheight_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelWidth = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kernelwidth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideDepth = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &stridedepth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideHeight = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &strideheight_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideWidth = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &stridewidth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingFront = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(64u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingfront_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingBack = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingback_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingTop = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingtop_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingBottom = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingbottom_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingLeft = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingleft_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingRight = 13;
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(104u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingright_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool countExcludePadding = 14;
      case 14: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(112u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &countexcludepadding_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Pooling3DLayerParams.Pooling3DPaddingType paddingType = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(120u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_paddingtype(static_cast< ::CoreML::Specification::Pooling3DLayerParams_Pooling3DPaddingType >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Pooling3DLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Pooling3DLayerParams)
  return false;
#undef DO_
}